

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::EncodePixelData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data,uchar **images,
               int compression_type,int param_4,int width,int param_6,int x_stride,int line_no,
               int num_lines,size_t pixel_data_size,
               vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list,
               string *err,void *compression_param)

{
  ulong uVar1;
  bool bVar2;
  undefined4 uVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference src;
  int in_EDX;
  long in_RSI;
  allocator_type *in_RDI;
  int in_R8D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  long in_stack_00000020;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_stack_00000028;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000030;
  string *in_stack_00000038;
  uint data_len_2;
  uint outSize_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_2;
  uint bufLen;
  uint data_len_1;
  tinyexr_uint64 outSize_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_1;
  uint data_len;
  tinyexr_uint64 outSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  uint val_2;
  int x_4;
  uint *line_ptr_4;
  int y_4;
  float val_1;
  int x_3;
  float *line_ptr_3;
  int y_3;
  FP16 h16_1;
  FP32 f32_1;
  int x_2;
  unsigned_short *line_ptr_2;
  int y_2;
  unsigned_short val;
  int x_1;
  unsigned_short *line_ptr_1;
  int y_1;
  FP32 f32;
  FP16 h16;
  int x;
  float *line_ptr;
  int y;
  size_t c;
  size_t start_y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t buf_size;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffc58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this;
  allocator_type *in_stack_fffffffffffffc60;
  size_type in_stack_fffffffffffffc68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffc98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffca0;
  const_iterator in_stack_fffffffffffffca8;
  unsigned_long in_stack_fffffffffffffcf8;
  uchar *in_stack_fffffffffffffd00;
  tinyexr_uint64 *in_stack_fffffffffffffd08;
  uchar *in_stack_fffffffffffffd10;
  tinyexr_uint64 *compressedSize;
  uchar *dst;
  int in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdfc;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe00;
  uint *in_stack_fffffffffffffe08;
  uchar *in_stack_fffffffffffffe10;
  int num_lines_00;
  undefined8 in_stack_fffffffffffffe20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  uchar *local_180;
  uchar *local_178;
  uchar *local_170;
  uchar *local_168;
  uchar *local_160;
  undefined4 local_14c;
  size_type local_148;
  uchar local_139;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  uchar *local_120;
  uchar *local_118;
  uchar *local_110;
  uchar *local_108;
  uint local_f8;
  int local_f4;
  reference local_f0;
  int local_e4;
  float local_e0;
  int local_dc;
  reference local_d8;
  int local_d0;
  FP32 local_cc;
  FP16 local_c8;
  FP16 local_c4;
  FP32 local_c0;
  int local_bc;
  reference local_b8;
  int local_b0;
  int local_ac;
  unsigned_short local_a6;
  int local_a4;
  reference local_a0;
  int local_94;
  FP16 local_90;
  FP32 local_8c;
  FP16 local_88;
  int local_84;
  reference local_80;
  int local_74;
  ulong local_70;
  long local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long local_30;
  int local_24;
  int local_1c;
  long local_18;
  allocator_type *local_10;
  byte local_1;
  
  local_30 = (long)in_R8D * (long)in_stack_00000018 * in_stack_00000020;
  local_24 = in_R8D;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x45711f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x45714b);
  local_68 = (long)in_stack_00000010;
  local_70 = 0;
  while( true ) {
    uVar1 = local_70;
    sVar4 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::size
                      (in_stack_00000028);
    num_lines_00 = (int)in_stack_fffffffffffffe20;
    if (sVar4 <= uVar1) break;
    pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (in_stack_00000028,local_70);
    if (pvVar5->pixel_type == 1) {
      pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
               operator[](in_stack_00000028,local_70);
      if (pvVar5->requested_pixel_type == 2) {
        for (local_74 = 0; local_74 < in_stack_00000018; local_74 = local_74 + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000030,local_70);
          local_80 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc50,
                                CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          for (local_84 = 0; local_84 < local_24; local_84 = local_84 + 1) {
            local_88.u = *(undefined2 *)
                          (*(long *)(local_18 + local_70 * 8) +
                          ((local_74 + local_68) * (long)in_stack_00000008 + (long)local_84) * 2);
            local_90 = local_88;
            local_8c = half_to_float(local_88);
            swap4(&local_8c.f);
            cpy4((float *)(local_80 + (long)local_84 * 4),&local_8c.f);
          }
        }
      }
      else {
        pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                 operator[](in_stack_00000028,local_70);
        if (pvVar5->requested_pixel_type != 1) {
          if (in_stack_00000038 != (string *)0x0) {
            std::__cxx11::string::operator+=(in_stack_00000038,"Invalid requested_pixel_type.\n");
          }
          local_1 = 0;
          local_ac = 1;
          goto LAB_004582b3;
        }
        for (local_94 = 0; local_94 < in_stack_00000018; local_94 = local_94 + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000030,local_70);
          local_a0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc50,
                                CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          for (local_a4 = 0; local_a4 < local_24; local_a4 = local_a4 + 1) {
            local_a6 = *(unsigned_short *)
                        (*(long *)(local_18 + local_70 * 8) +
                        ((local_94 + local_68) * (long)in_stack_00000008 + (long)local_a4) * 2);
            swap2(&local_a6);
            cpy2((unsigned_short *)(local_a0 + (long)local_a4 * 2),&local_a6);
          }
        }
      }
    }
    else {
      pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
               operator[](in_stack_00000028,local_70);
      if (pvVar5->pixel_type == 2) {
        pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                 operator[](in_stack_00000028,local_70);
        if (pvVar5->requested_pixel_type == 1) {
          for (local_b0 = 0; local_b0 < in_stack_00000018; local_b0 = local_b0 + 1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (in_stack_00000030,local_70);
            local_b8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (in_stack_fffffffffffffc50,
                                  CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
            for (local_bc = 0; local_bc < local_24; local_bc = local_bc + 1) {
              local_cc = *(FP32 *)(*(long *)(local_18 + local_70 * 8) +
                                  ((local_b0 + local_68) * (long)in_stack_00000008 + (long)local_bc)
                                  * 4);
              local_c0 = local_cc;
              local_c8 = float_to_half_full(local_cc);
              local_c4 = local_c8;
              swap2(&local_c4.u);
              cpy2((unsigned_short *)(local_b8 + (long)local_bc * 2),&local_c4.u);
            }
          }
        }
        else {
          pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                   operator[](in_stack_00000028,local_70);
          if (pvVar5->requested_pixel_type != 2) {
            if (in_stack_00000038 != (string *)0x0) {
              std::__cxx11::string::operator+=(in_stack_00000038,"Invalid requested_pixel_type.\n");
            }
            local_1 = 0;
            local_ac = 1;
            goto LAB_004582b3;
          }
          for (local_d0 = 0; local_d0 < in_stack_00000018; local_d0 = local_d0 + 1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (in_stack_00000030,local_70);
            local_d8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (in_stack_fffffffffffffc50,
                                  CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
            for (local_dc = 0; local_dc < local_24; local_dc = local_dc + 1) {
              local_e0 = *(float *)(*(long *)(local_18 + local_70 * 8) +
                                   ((local_d0 + local_68) * (long)in_stack_00000008 + (long)local_dc
                                   ) * 4);
              swap4(&local_e0);
              cpy4((float *)(local_d8 + (long)local_dc * 4),&local_e0);
            }
          }
        }
      }
      else {
        pvVar5 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                 operator[](in_stack_00000028,local_70);
        if (pvVar5->pixel_type == 0) {
          for (local_e4 = 0; local_e4 < in_stack_00000018; local_e4 = local_e4 + 1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (in_stack_00000030,local_70);
            local_f0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (in_stack_fffffffffffffc50,
                                  CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
            for (local_f4 = 0; local_f4 < local_24; local_f4 = local_f4 + 1) {
              local_f8 = *(uint *)(*(long *)(local_18 + local_70 * 8) +
                                  ((local_e4 + local_68) * (long)in_stack_00000008 + (long)local_f4)
                                  * 4);
              swap4(&local_f8);
              cpy4((uint *)(local_f0 + (long)local_f4 * 4),&local_f8);
            }
          }
        }
      }
    }
    local_70 = local_70 + 1;
  }
  if (local_1c == 0) {
    local_108 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc50,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    local_110 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    local_118 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    local_120 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                         insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                   (in_stack_fffffffffffffc90,in_stack_fffffffffffffca8,
                                    in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  }
  else if ((local_1c == 2) || (local_1c == 3)) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
    compressedSize = (tinyexr_uint64 *)(sVar4 * 2 + 0x100);
    dst = &local_139;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x457be9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x457c15);
    pvVar6 = &local_138;
    local_148 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar6);
    src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                    (in_stack_fffffffffffffc50,
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
    bVar2 = CompressZip(dst,compressedSize,src,(unsigned_long)pvVar6);
    if (bVar2) {
      local_14c = (undefined4)local_148;
      local_160 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffc50,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      local_168 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))
      ;
      local_178 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))
      ;
      local_170 = (uchar *)__gnu_cxx::
                           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator+(in_stack_fffffffffffffc58,
                                       (difference_type)in_stack_fffffffffffffc50);
      local_180 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                     (in_stack_fffffffffffffc90,in_stack_fffffffffffffca8,
                                      in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      local_ac = 0;
    }
    else {
      if (in_stack_00000038 != (string *)0x0) {
        std::__cxx11::string::operator+=(in_stack_00000038,"Zip compresssion failed.\n");
      }
      local_1 = 0;
      local_ac = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc60);
    if (local_ac != 0) goto LAB_004582b3;
  }
  else if (local_1c == 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x457e72);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x457e9e);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_198);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
    CompressRle(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                in_stack_fffffffffffffcf8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc50,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    __last._M_current = (uchar *)&local_198;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+(in_stack_fffffffffffffc58,(difference_type)in_stack_fffffffffffffc50);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffca8,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_10,__last);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc60);
  }
  else {
    if (local_1c != 4) {
      if (local_1c == 0x80) {
        if (in_stack_00000038 != (string *)0x0) {
          std::__cxx11::string::operator+=
                    (in_stack_00000038,"ZFP compression is disabled in this build.\n");
        }
        local_1 = 0;
        local_ac = 1;
      }
      else {
        local_1 = 0;
        local_ac = 1;
      }
      goto LAB_004582b3;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
    pvVar6 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xfffffffffffffdff;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x458074);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x45809a);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &stack0xfffffffffffffe00);
    uVar3 = (undefined4)sVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_48);
    CompressPiz(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                in_stack_fffffffffffffe00._M_current,CONCAT44(in_stack_fffffffffffffdfc,uVar3),
                (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                in_stack_fffffffffffffdec,num_lines_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_00000018));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffc50,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_00000018));
    this = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)&stack0xfffffffffffffe00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_00000018));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_00000018));
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+(this,(difference_type)in_stack_fffffffffffffc50);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (pvVar6,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_10);
    in_stack_fffffffffffffc60 = local_10;
  }
  local_1 = 1;
  local_ac = 1;
LAB_004582b3:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc60);
  return (bool)(local_1 & 1);
}

Assistant:

static bool EncodePixelData(/* out */ std::vector<unsigned char>& out_data,                         
                            const unsigned char* const* images,
                            int compression_type,
                            int /*line_order*/,
                            int width, // for tiled : tile.width
                            int /*height*/, // for tiled : header.tile_size_y
                            int x_stride, // for tiled : header.tile_size_x
                            int line_no, // for tiled : 0
                            int num_lines, // for tiled : tile.height
                            size_t pixel_data_size,
                            const std::vector<ChannelInfo>& channels,
                            const std::vector<size_t>& channel_offset_list,
                            std::string *err,
                            const void* compression_param = 0) // zfp compression param
{
  size_t buf_size = static_cast<size_t>(width) *
                  static_cast<size_t>(num_lines) *
                  static_cast<size_t>(pixel_data_size);
  //int last2bit = (buf_size & 3);
  // buf_size must be multiple of four
  //if(last2bit) buf_size += 4 - last2bit;
  std::vector<unsigned char> buf(buf_size);

  size_t start_y = static_cast<size_t>(line_no);
  for (size_t c = 0; c < channels.size(); c++) {
    if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * size_t(y) * size_t(width)) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP16 h16;
            h16.u = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * size_t(x_stride) + size_t(x)];

            tinyexr::FP32 f32 = half_to_float(h16);

            tinyexr::swap4(&f32.f);

            // line_ptr[x] = f32.f;
            tinyexr::cpy4(line_ptr + x, &(f32.f));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            unsigned short val = reinterpret_cast<const unsigned short * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap2(&val);

            // line_ptr[x] = val;
            tinyexr::cpy2(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }

    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
      if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
            &buf.at(static_cast<size_t>(pixel_data_size * y *
                                        width) +
                    channel_offset_list[c] *
                    static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            tinyexr::FP32 f32;
            f32.f = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::FP16 h16;
            h16 = float_to_half_full(f32);

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&h16.u));

            // line_ptr[x] = h16.u;
            tinyexr::cpy2(line_ptr + x, &(h16.u));
          }
        }
      } else if (channels[c].requested_pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        for (int y = 0; y < num_lines; y++) {
          // Assume increasing Y
          float *line_ptr = reinterpret_cast<float *>(&buf.at(
            static_cast<size_t>(pixel_data_size * y * width) +
            channel_offset_list[c] *
            static_cast<size_t>(width)));
          for (int x = 0; x < width; x++) {
            float val = reinterpret_cast<const float * const *>(
              images)[c][(y + start_y) * x_stride + x];

            tinyexr::swap4(&val);

            // line_ptr[x] = val;
            tinyexr::cpy4(line_ptr + x, &val);
          }
        }
      } else {
        if (err) {
          (*err) += "Invalid requested_pixel_type.\n";
        }
        return false;
      }
    } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
      for (int y = 0; y < num_lines; y++) {
        // Assume increasing Y
        unsigned int *line_ptr = reinterpret_cast<unsigned int *>(&buf.at(
          static_cast<size_t>(pixel_data_size * y * width) +
          channel_offset_list[c] * static_cast<size_t>(width)));
        for (int x = 0; x < width; x++) {
          unsigned int val = reinterpret_cast<const unsigned int * const *>(
            images)[c][(y + start_y) * x_stride + x];

          tinyexr::swap4(&val);

          // line_ptr[x] = val;
          tinyexr::cpy4(line_ptr + x, &val);
        }
      }
    }
  }

  if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(uncompressed)
    out_data.insert(out_data.end(), buf.begin(), buf.end());

  } else if ((compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS) ||
    (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP)) {
#if TINYEXR_USE_MINIZ
    std::vector<unsigned char> block(mz_compressBound(
      static_cast<unsigned long>(buf.size())));
#elif TINYEXR_USE_STB_ZLIB
    // there is no compressBound() function, so we use a value that
    // is grossly overestimated, but should always work
    std::vector<unsigned char> block(256 + 2 * buf.size());
#else
    std::vector<unsigned char> block(
      compressBound(static_cast<uLong>(buf.size())));
#endif
    tinyexr::tinyexr_uint64 outSize = block.size();

    if (!tinyexr::CompressZip(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()))) {
      if (err) {
        (*err) += "Zip compresssion failed.\n";
      }
      return false;
    }

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate

    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // (buf.size() * 3) / 2 would be enough.
    std::vector<unsigned char> block((buf.size() * 3) / 2);

    tinyexr::tinyexr_uint64 outSize = block.size();

    tinyexr::CompressRle(&block.at(0), outSize,
                         reinterpret_cast<const unsigned char *>(&buf.at(0)),
                         static_cast<unsigned long>(buf.size()));

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = static_cast<unsigned int>(outSize);  // truncate
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
    unsigned int bufLen =
      8192 + static_cast<unsigned int>(
        2 * static_cast<unsigned int>(
          buf.size()));  // @fixme { compute good bound. }
    std::vector<unsigned char> block(bufLen);
    unsigned int outSize = static_cast<unsigned int>(block.size());

    CompressPiz(&block.at(0), &outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size(), channels, width, num_lines);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "PIZ compression is disabled in this build.\n";
    }
    return false;
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    const ZFPCompressionParam* zfp_compression_param = reinterpret_cast<const ZFPCompressionParam*>(compression_param);
    std::vector<unsigned char> block;
    unsigned int outSize;

    tinyexr::CompressZfp(
      &block, &outSize, reinterpret_cast<const float *>(&buf.at(0)),
      width, num_lines, static_cast<int>(channels.size()), *zfp_compression_param);

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    unsigned int data_len = outSize;
    out_data.insert(out_data.end(), block.begin(), block.begin() + data_len);

#else
    if (err) {
      (*err) += "ZFP compression is disabled in this build.\n";
    }
    (void)compression_param;
    return false;
#endif
  } else {
    return false;
  }

  return true;
}